

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repattrn.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::RegexPattern::pattern(UnicodeString *__return_storage_ptr__,RegexPattern *this)

{
  int32_t minCapacity;
  int64_t limit;
  char16_t *dest;
  UChar *resultChars;
  int32_t len16;
  int64_t nativeLen;
  RegexPattern *pRStack_18;
  UErrorCode status;
  RegexPattern *this_local;
  UnicodeString *result;
  
  pRStack_18 = this;
  this_local = (RegexPattern *)__return_storage_ptr__;
  if (this->fPatternString == (UnicodeString *)0x0) {
    if (this->fPattern == (UText *)0x0) {
      icu_63::UnicodeString::UnicodeString(__return_storage_ptr__);
    }
    else {
      nativeLen._4_4_ = 0;
      limit = utext_nativeLength_63(this->fPattern);
      minCapacity = utext_extract_63(this->fPattern,0,limit,(UChar *)0x0,0,
                                     (UErrorCode *)((long)&nativeLen + 4));
      icu_63::UnicodeString::UnicodeString(__return_storage_ptr__);
      nativeLen._4_4_ = 0;
      dest = icu_63::UnicodeString::getBuffer(__return_storage_ptr__,minCapacity);
      utext_extract_63(this->fPattern,0,limit,dest,minCapacity,(UErrorCode *)((long)&nativeLen + 4))
      ;
      icu_63::UnicodeString::releaseBuffer(__return_storage_ptr__,minCapacity);
    }
  }
  else {
    icu_63::UnicodeString::UnicodeString(__return_storage_ptr__,this->fPatternString);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString RegexPattern::pattern() const {
    if (fPatternString != NULL) {
        return *fPatternString;
    } else if (fPattern == NULL) {
        return UnicodeString();
    } else {
        UErrorCode status = U_ZERO_ERROR;
        int64_t nativeLen = utext_nativeLength(fPattern);
        int32_t len16 = utext_extract(fPattern, 0, nativeLen, NULL, 0, &status); // buffer overflow error
        UnicodeString result;

        status = U_ZERO_ERROR;
        UChar *resultChars = result.getBuffer(len16);
        utext_extract(fPattern, 0, nativeLen, resultChars, len16, &status); // unterminated warning
        result.releaseBuffer(len16);

        return result;
    }
}